

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionGlobalMergeStates::PartitionGlobalMergeStates
          (PartitionGlobalMergeStates *this,PartitionGlobalSinkState *sink)

{
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *this_00;
  pointer puVar1;
  pointer this_01;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar2;
  pointer this_02;
  idx_t *piVar3;
  templated_unique_single_t state_1;
  templated_unique_single_t state;
  
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->states).
  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((sink->grouping_data).
      super_unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RadixPartitionedTupleData_*,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::RadixPartitionedTupleData_*,_false>._M_head_impl ==
      (RadixPartitionedTupleData *)0x0) {
    state_1.
    super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
          )(__uniq_ptr_data<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true,_true>
            )0x1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sink->bin_groups,1,
               (value_type_conflict1 *)&state_1);
    make_uniq<duckdb::PartitionGlobalMergeState,duckdb::PartitionGlobalSinkState&>
              ((duckdb *)&state_1,sink);
    ::std::
    vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
                *)this,&state_1);
    ::std::
    unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ::~unique_ptr(&state_1.
                   super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                 );
  }
  else {
    this_01 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
              ::operator->(&sink->grouping_data);
    puVar2 = PartitionedTupleData::GetPartitions(&this_01->super_PartitionedTupleData);
    state_1.
    super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
          )((long)(puVar2->
                  super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(puVar2->
                  super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sink->bin_groups,
               (size_type)
               state_1.
               super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
               .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl,
               (value_type_conflict1 *)&state_1);
    state_1.
    super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
    .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl =
         (unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
          )(__uniq_ptr_data<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true,_true>
            )0x0;
    while( true ) {
      puVar1 = (puVar2->
               super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(puVar2->
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
          (ulong)state_1.
                 super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                 .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl)
      break;
      this_00 = puVar1 + (long)state_1.
                               super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                               .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>.
                               _M_head_impl;
      this_02 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator->(this_00);
      piVar3 = TupleDataCollection::Count(this_02);
      if (*piVar3 != 0) {
        make_uniq<duckdb::PartitionGlobalMergeState,duckdb::PartitionGlobalSinkState&,duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>,unsigned_long&>
                  ((duckdb *)&state,sink,this_00,(unsigned_long *)&state_1);
        ::std::
        vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>,std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalMergeState,std::default_delete<duckdb::PartitionGlobalMergeState>,true>>>
                    *)this,(unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>,_true>
                            *)&state);
        ::std::
        unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
        ::~unique_ptr((unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                       *)&state);
      }
      state_1.
      super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
      .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl =
           (unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
            )((long)state_1.
                    super_unique_ptr<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::PartitionGlobalMergeState,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::PartitionGlobalMergeState_*,_std::default_delete<duckdb::PartitionGlobalMergeState>_>
                    .super__Head_base<0UL,_duckdb::PartitionGlobalMergeState_*,_false>._M_head_impl
             + 1);
    }
  }
  (*sink->_vptr_PartitionGlobalSinkState[2])(sink);
  return;
}

Assistant:

PartitionGlobalMergeStates::PartitionGlobalMergeStates(PartitionGlobalSinkState &sink) {
	// Schedule all the sorts for maximum thread utilisation
	if (sink.grouping_data) {
		auto &partitions = sink.grouping_data->GetPartitions();
		sink.bin_groups.resize(partitions.size(), partitions.size());
		for (hash_t hash_bin = 0; hash_bin < partitions.size(); ++hash_bin) {
			auto &group_data = partitions[hash_bin];
			// Prepare for merge sort phase
			if (group_data->Count()) {
				auto state = make_uniq<PartitionGlobalMergeState>(sink, std::move(group_data), hash_bin);
				states.emplace_back(std::move(state));
			}
		}
	} else {
		//	OVER(ORDER BY...)
		//	Already sunk into the single global sort, so set up single merge with no data
		sink.bin_groups.resize(1, 1);
		auto state = make_uniq<PartitionGlobalMergeState>(sink);
		states.emplace_back(std::move(state));
	}

	sink.OnBeginMerge();
}